

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prscomp.c
# Opt level: O1

void prscode(prscxdef *ctx,int markcomp)

{
  char *pcVar1;
  ushort *puVar2;
  byte *pbVar3;
  ushort *puVar4;
  char cVar5;
  uchar uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  mcmcxdef *pmVar10;
  toktdef *ptVar11;
  _func_void_toktdef_ptr_char_ptr_int_int_int_int *p_Var12;
  lindef *plVar13;
  emtcxdef *peVar14;
  uint16_t tmp;
  prpnum pVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  uchar *puVar21;
  size_t sVar22;
  uchar *puVar23;
  toktldef *lcltab;
  uint uVar24;
  uchar *puVar25;
  ulong uVar26;
  long lVar27;
  uchar *puVar28;
  char *pcVar29;
  uint16_t tmp_1;
  uint uVar30;
  prscxdef *ppVar31;
  tokdef *ptVar32;
  tokcxdef *ptVar33;
  tokdef *ptVar34;
  errcxdef *ctx_00;
  ulong uVar35;
  bool bVar36;
  byte bVar37;
  int varargs;
  prscxdef *local_250;
  int local_244;
  uint curfr;
  int local_23c;
  int local_238;
  uint local_234;
  uchar *local_230;
  ulong local_228;
  toktdef *local_220;
  tokdef tok;
  int parms;
  objnum sc [64];
  
  bVar37 = 0;
  ptVar33 = ctx->prscxtok;
  uVar30 = (ptVar33->tokcxcur).toktyp;
  if ((int)uVar30 < 0x57) {
    if (uVar30 == 1) {
      return;
    }
    if (uVar30 == 0x3e) goto LAB_0011bf30;
  }
  else {
    if (uVar30 == 0x57) {
      iVar17 = toknext(ptVar33);
      if (iVar17 == 0x36) {
        uVar7 = (ctx->prscxtok->tokcxcur).tokofs;
        iVar17 = toknext(ctx->prscxtok);
        if (iVar17 == 0x36) {
          uVar9 = (ctx->prscxtok->tokcxcur).tokofs;
          iVar17 = toknext(ctx->prscxtok);
          if (iVar17 == 0x36) {
            puVar23 = ctx->prscxpool + uVar7;
            puVar21 = ctx->prscxpool + uVar9;
            uVar7 = (ctx->prscxtok->tokcxcur).tokofs;
            prsnreq(ctx,0x3e);
            uVar30 = (uint)*(ushort *)(ctx->prscxpool + uVar7) +
                     (uint)*(ushort *)puVar21 + (uint)*(ushort *)puVar23;
            if ((ctx->prscxcpp == (char *)0x0) ||
               (ctx->prscxcps - (ulong)ctx->prscxcpf < (ulong)uVar30)) {
              uVar20 = (ulong)((int)ctx->prscxcps + uVar30 + 0x100);
              puVar28 = mchalo(ctx->prscxerr,uVar20,"prscmpd");
              if (ctx->prscxcpp != (char *)0x0) {
                memcpy(puVar28,ctx->prscxcpp,ctx->prscxcps);
                free(ctx->prscxcpp);
              }
              ctx->prscxcpp = (char *)puVar28;
              ctx->prscxcps = uVar20;
            }
            pcVar29 = ctx->prscxcpp + ctx->prscxcpf;
            memcpy(pcVar29,puVar23,(ulong)*(ushort *)puVar23);
            uVar9 = *(ushort *)puVar23;
            memcpy(pcVar29 + uVar9,puVar21,(ulong)*(ushort *)puVar21);
            memcpy(pcVar29 + uVar9 + *(ushort *)puVar21,ctx->prscxpool + uVar7,
                   (ulong)*(ushort *)(ctx->prscxpool + uVar7));
            ctx->prscxcpf = ctx->prscxcpf + uVar30;
            return;
          }
          ctx_00 = ctx->prscxerr;
          goto LAB_0011cdf2;
        }
      }
      ctx_00 = ctx->prscxerr;
LAB_0011cdf2:
      errsigf(ctx_00,"TADS",0x153);
    }
    if (uVar30 == 0x5b) {
      iVar17 = toknext(ptVar33);
      if (iVar17 != 0x36) {
        errsigf(ctx->prscxerr,"TADS",0x154);
      }
      uVar7 = (ctx->prscxtok->tokcxcur).tokofs;
      puVar23 = ctx->prscxpool + uVar7;
      sVar22 = (size_t)*(ushort *)puVar23;
      uVar20 = sVar22 - 2;
      if (sVar22 == 2) {
        sVar22 = 2;
      }
      else {
        puVar21 = ctx->prscxpool + (ulong)uVar7 + 2;
        uVar26 = 0;
        puVar28 = puVar21;
        do {
          uVar35 = (ulong)(*puVar21 == '\\');
          sVar22 = sVar22 - uVar35;
          puVar25 = puVar21 + uVar35;
          puVar21 = puVar25 + 1;
          *puVar28 = *puVar25;
          puVar28 = puVar28 + 1;
          uVar26 = uVar35 + uVar26 + 1;
        } while (uVar26 < uVar20);
      }
      *(ushort *)puVar23 = (ushort)sVar22;
      toknext(ctx->prscxtok);
      pVar15 = prsrqpr(ctx);
      if ((ctx->prscxfsp == (uchar *)0x0) || (ctx->prscxfss - (ulong)ctx->prscxfsf < sVar22 + 2)) {
        uVar20 = (ulong)((int)ctx->prscxfss + (int)sVar22 + 0x100);
        puVar21 = mchalo(ctx->prscxerr,uVar20,"prsfmt");
        if (ctx->prscxfsp != (uchar *)0x0) {
          memcpy(puVar21,ctx->prscxfsp,ctx->prscxfss);
          free(ctx->prscxfsp);
        }
        ctx->prscxfsp = puVar21;
        ctx->prscxfss = uVar20;
      }
      puVar21 = ctx->prscxfsp;
      uVar30 = ctx->prscxfsf;
      *(prpnum *)(puVar21 + uVar30) = pVar15;
      memcpy((prpnum *)((long)(puVar21 + uVar30) + 2),puVar23,sVar22);
      ctx->prscxfsf = ctx->prscxfsf + (int)sVar22 + 2;
      ppVar31 = ctx;
      goto LAB_0011c9d4;
    }
  }
  if ((uVar30 & 0xfffffffe) == 0xce) {
    uVar16 = toknext(ptVar33);
    uVar24 = uVar30;
  }
  else {
    uVar24 = 0;
    uVar16 = uVar30;
  }
  local_250 = ctx;
  if (uVar16 == 0x50) {
    uVar16 = toknext(ctx->prscxtok);
    iVar17 = 1;
  }
  else {
    iVar17 = 0;
    if (uVar16 == 0xcd) {
      if ((((char)uVar24 == -0x32) || ((uVar24 & 0xff) == 0)) && (ctx->prscxspp != (char *)0x0)) {
        if (uVar24 == 0) {
          errlogf(ctx->prscxerr,"TADS",0x15e);
        }
        free(ctx->prscxspp);
        ctx->prscxspp = (char *)0x0;
        ctx->prscxsps = 0;
        ctx->prscxspf = 0;
      }
      prsspec_defp = &prsspec_defaults;
      uVar26 = 0;
      bVar37 = 0x4f;
      uVar20 = uVar26;
      do {
        ppVar31 = local_250;
        local_234 = (uint)uVar20;
        local_228 = uVar26;
        do {
          uVar30 = (uint)uVar20;
          if (((uVar30 == 0) && (iVar17 = toknext(ppVar31->prscxtok), iVar17 != 0x36)) &&
             (iVar17 != 0x4d)) goto LAB_0011cd94;
          if (iVar17 == 0x4d && uVar30 == 0) {
            if (uVar24 != 0xcf) {
              errsigf(ppVar31->prscxerr,"TADS",0x15f);
            }
            iVar18 = toknext(ppVar31->prscxtok);
            break;
          }
          local_238 = iVar17;
          if (uVar30 == 0) {
            uVar26 = (ulong)(ppVar31->prscxtok->tokcxcur).tokofs;
            sVar22 = (ulong)*(ushort *)(ppVar31->prscxpool + uVar26) - 2;
            puVar23 = ctx->prscxpool + uVar26 + 2;
            goto LAB_0011c2ad;
          }
          bVar36 = *(long *)(prsspec_defp + 8) == 0;
          if (bVar36) {
LAB_0011cd94:
            errsigf(ppVar31->prscxerr,"TADS",0x157);
          }
          cVar5 = *prsspec_defp;
          while ((int)cVar5 != (uint)bVar37) {
            pcVar29 = prsspec_defp + 0x10;
            bVar36 = *(long *)(prsspec_defp + 0x18) == 0;
            prsspec_defp = pcVar29;
            if (bVar36) goto LAB_0011cd94;
            cVar5 = *pcVar29;
          }
          if (bVar36) goto LAB_0011cd94;
          do {
            puVar23 = *(uchar **)(prsspec_defp + 8);
            sVar22 = strlen((char *)puVar23);
LAB_0011c2ad:
            if ((ppVar31->prscxspp == (char *)0x0) ||
               (ppVar31->prscxsps - (ulong)ppVar31->prscxspf < sVar22 + 2)) {
              uVar20 = (ulong)((int)ppVar31->prscxsps + (int)sVar22 + 0x80);
              puVar21 = mchalo(ppVar31->prscxerr,uVar20,"prsspec");
              if (ppVar31->prscxspp != (char *)0x0) {
                memcpy(puVar21,ppVar31->prscxspp,ppVar31->prscxsps);
                free(ppVar31->prscxspp);
              }
              ppVar31->prscxspp = (char *)puVar21;
              ppVar31->prscxsps = uVar20;
              uVar20 = (ulong)local_234;
            }
            pbVar3 = (byte *)(ppVar31->prscxspp + ppVar31->prscxspf);
            *pbVar3 = bVar37;
            pbVar3[1] = (byte)sVar22;
            memcpy(pbVar3 + 2,puVar23,sVar22);
            ppVar31->prscxspf = ppVar31->prscxspf + (int)sVar22 + 2;
            uVar30 = (uint)uVar20;
            if (uVar30 == 0) {
              iVar18 = toknext(ppVar31->prscxtok);
              break;
            }
            pcVar29 = prsspec_defp + 0x10;
            pcVar1 = prsspec_defp + 0x10;
            iVar18 = local_238;
            prsspec_defp = pcVar29;
          } while ((int)*pcVar1 == (uint)bVar37);
          iVar17 = 7;
        } while (iVar18 == 7);
        iVar17 = iVar18;
        uVar20 = (ulong)uVar30;
        if (iVar17 == 0x3e && uVar30 == 0) {
          uVar20 = 1;
        }
        bVar37 = prsspec_wordtypes[local_228 + 1];
        if (((bVar37 != 0) && ((int)uVar20 == 0)) && (iVar17 != 0x3f)) {
          prssigreq(local_250,0x3f);
        }
        uVar26 = local_228 + 1;
        ppVar31 = local_250;
      } while (uVar26 != 0xd);
      goto LAB_0011c9d4;
    }
  }
  if (uVar16 != 0x38) {
    errsigf(ctx->prscxerr,"TADS",0x12d);
  }
  ptVar32 = &ctx->prscxtok->tokcxcur;
  ptVar34 = &tok;
  for (lVar27 = 0xe; lVar27 != 0; lVar27 = lVar27 + -1) {
    iVar18 = ptVar32->toklen;
    ptVar34->toktyp = ptVar32->toktyp;
    ptVar34->toklen = iVar18;
    ptVar32 = (tokdef *)((long)ptVar32 + (ulong)bVar37 * -0x10 + 8);
    ptVar34 = (tokdef *)((long)ptVar34 + (ulong)bVar37 * -0x10 + 8);
  }
  local_244 = markcomp;
  if (uVar24 == 0xcf) {
    if ((tok.toksym.tokstyp != '\x02') ||
       (ctx->prscxvoc->voccxinh[tok.toksym.toksval >> 8][(byte)tok.toksym.toksval] == (vocidef *)0x0
       )) {
      errsigf(ctx->prscxerr,"TADS",0x15d);
    }
    pmVar10 = ctx->prscxmem;
    uVar7 = pmVar10->mcmcxgl->mcmcxtab
            [*(byte *)((long)pmVar10->mcmcxmtb[tok.toksym.toksval >> 8] +
                      (ulong)(tok.toksym.toksval & 0xff) * 2 + 1)]
            [(byte)pmVar10->mcmcxmtb[tok.toksym.toksval >> 8][tok.toksym.toksval & 0xff]].mcmosiz;
    puVar23 = mcmalo0(pmVar10,uVar7,(mcmon *)&varargs,0xffff,0);
    puVar21 = mcmlck(ctx->prscxmem,tok.toksym.toksval);
    memcpy(puVar23,puVar21,(ulong)uVar7);
    if ((*(ushort *)(puVar23 + 2) & 1) != 0) {
      iVar17 = 1;
    }
    *(ushort *)(puVar23 + 2) = *(ushort *)(puVar23 + 2) | 5;
    uVar7 = ctx->prscxmem->mcmcxmtb[(ushort)varargs >> 8][varargs & 0xff];
    puVar4 = (ushort *)
             ((long)&ctx->prscxmem->mcmcxgl->mcmcxtab[uVar7 >> 8]->mcmoflg +
             (ulong)((uVar7 & 0xff) << 5));
    *puVar4 = *puVar4 | 1;
    local_23c = iVar17;
    mcmunlck(ctx->prscxmem,tok.toksym.toksval);
    mcmunlck(ctx->prscxmem,(ushort)varargs);
    uVar30 = 0x22;
    if (tok.toksym.tokslen < 0x22) {
      uVar30 = (uint)tok.toksym.tokslen;
    }
    sprintf((char *)&parms,"%.*s@%d",(ulong)uVar30,tok.toksym.toksnam,(ulong)(ushort)varargs);
    ptVar11 = ctx->prscxstab;
    p_Var12 = ptVar11->toktfadd;
    sVar22 = strlen((char *)&parms);
    iVar17 = varargs;
    uVar19 = tokhsh((char *)&parms);
    (*p_Var12)(ptVar11,(char *)&parms,(int)sVar22,2,(int)iVar17,uVar19);
    ctx = local_250;
    sc[0] = (ushort)varargs;
    vociren(local_250->prscxvoc,tok.toksym.toksval,(ushort)varargs);
    for (plVar13 = ctx->prscxvoc->voccxrun->runcxdbg->dbgcxlin; plVar13 != (lindef *)0x0;
        plVar13 = plVar13->linnxt) {
      (*plVar13->linrenp)(plVar13,tok.toksym.toksval,(ushort)varargs);
    }
    toknext(ctx->prscxtok);
    iVar18 = 1;
    iVar17 = local_23c;
  }
  else {
    prsnreq(ctx,0x34);
    iVar18 = (ctx->prscxtok->tokcxcur).toktyp;
    if (iVar18 < 0x49) {
      if (iVar18 != 0x38) {
        if (iVar18 == 0x46) {
          prsdef(ctx,&tok,8);
          iVar17 = toknext(ctx->prscxtok);
          ppVar31 = local_250;
          if (iVar17 != 0x3e) {
            if ((tok.toksym.tokstyp != '\b') && ((uVar24 != 0xce || (tok.toksym.tokstyp != '\x01')))
               ) {
              errlogf(local_250->prscxerr,"TADS",0x146);
              tok.toksym.tokstyp = '\0';
              (*ppVar31->prscxstab->toktfset)(ppVar31->prscxstab,&tok.toksym);
              prsdef(ppVar31,&tok,8);
            }
            ppVar31 = local_250;
            tok.toksym.tokstyp = '\x01';
            (*local_250->prscxstab->toktfset)(local_250->prscxstab,&tok.toksym);
            local_230 = ppVar31->prscxplcl;
            local_220 = ppVar31->prscxtok->tokcxstab;
            uVar8 = ppVar31->prscxslcl;
            varargs = 0;
            parms = 0;
            curfr = 0;
            if (iVar17 == 0x32) {
              lcltab = prsvlst(ppVar31,(toktldef *)0x0,(prsndef **)0x0,&parms,1,&varargs,0);
              prsreq(ppVar31,0x33);
            }
            else {
              lcltab = (toktldef *)0x0;
            }
            if (uVar24 == 0xce) {
              for (plVar13 = ppVar31->prscxvoc->voccxrun->runcxdbg->dbgcxlin;
                  plVar13 != (lindef *)0x0; plVar13 = plVar13->linnxt) {
                (*plVar13->lindelp)(plVar13,tok.toksym.toksval);
              }
            }
            puVar23 = mcmlck(ppVar31->prscxmem,tok.toksym.toksval);
            ppVar31->prscxemt->emtcxptr = puVar23;
            ppVar31->prscxemt->emtcxofs = 0;
            ppVar31->prscxemt->emtcxobj = tok.toksym.toksval;
            uVar7 = (ushort)*(undefined4 *)&ppVar31->prscxflg;
            ppVar31->prscxflg = uVar7 | 0x40;
            sc._8_4_ = _setjmp((__jmp_buf_tag *)(sc + 0x38));
            if (sc._8_4_ == 0) {
              sc._0_8_ = ppVar31->prscxerr->errcxptr;
              ppVar31->prscxerr->errcxptr = (errdef *)sc;
              if ((ppVar31->prscxflg & 8) != 0) {
                emtres(ppVar31->prscxemt,1);
                ppVar31 = local_250;
                peVar14 = local_250->prscxemt;
                uVar9 = peVar14->emtcxofs;
                peVar14->emtcxofs = uVar9 + 1;
                peVar14->emtcxptr[uVar9] = 'M';
                emtres(local_250->prscxemt,1);
                peVar14 = ppVar31->prscxemt;
                uVar9 = peVar14->emtcxofs;
                peVar14->emtcxofs = uVar9 + 1;
                peVar14->emtcxptr[uVar9] = (varargs != 0) * -0x80 + (char)parms;
              }
              if (lcltab != (toktldef *)0x0) {
                prsvgfr(ppVar31,lcltab,&curfr);
              }
              if ((ppVar31->prscxtok->tokcxcur).toktyp == 0x3c) {
                prsstm(ppVar31,0xffff,0xffff,parms,0,0,(prscsdef *)0x0,curfr);
                emtres(ppVar31->prscxemt,1);
                peVar14 = ppVar31->prscxemt;
                uVar9 = peVar14->emtcxofs;
                peVar14->emtcxofs = uVar9 + 1;
                peVar14->emtcxptr[uVar9] = '\x16';
                emtres(ppVar31->prscxemt,2);
                puVar23 = ppVar31->prscxemt->emtcxptr + ppVar31->prscxemt->emtcxofs;
                puVar23[0] = '\0';
                puVar23[1] = '\0';
                puVar2 = &ppVar31->prscxemt->emtcxofs;
                *puVar2 = *puVar2 + 2;
                ppVar31->prscxplcl = local_230;
                ppVar31->prscxslcl = uVar8;
                mcmrealo(ppVar31->prscxmem,tok.toksym.toksval,ppVar31->prscxemt->emtcxofs);
                pmVar10 = ppVar31->prscxmem;
                puVar2 = &pmVar10->mcmcxgl->mcmcxtab
                          [*(byte *)((long)pmVar10->mcmcxmtb[tok.toksym.toksval >> 8] +
                                    (ulong)(tok.toksym.toksval & 0xff) * 2 + 1)]
                          [(byte)pmVar10->mcmcxmtb[tok.toksym.toksval >> 8]
                                 [tok.toksym.toksval & 0xff]].mcmoflg;
                *puVar2 = *puVar2 | 1;
                mcmunlck(ppVar31->prscxmem,tok.toksym.toksval);
                ppVar31->prscxemt->emtcxptr = (uchar *)0x0;
                ppVar31->prscxtok->tokcxstab = local_220;
                ppVar31->prscxflg = uVar7;
                prsdelgoto(ppVar31);
                ppVar31->prscxerr->errcxptr = (errdef *)sc._0_8_;
                return;
              }
              prssigreq(ppVar31,0x3c);
            }
            ppVar31->prscxerr->errcxptr = (errdef *)sc._0_8_;
            ppVar31->prscxplcl = local_230;
            ppVar31->prscxslcl = uVar8;
            ppVar31->prscxtok->tokcxstab = local_220;
            ppVar31->prscxflg = uVar7;
            prsdelgoto(ppVar31);
            mcmunlck(ppVar31->prscxmem,tok.toksym.toksval);
            errrse1(ppVar31->prscxerr,(errdef *)sc);
          }
          if (uVar24 != 0) {
            errlogf(local_250->prscxerr,"TADS",0x15c);
          }
          if ((tok.toksym.tokstyp != '\b') && (tok.toksym.tokstyp != '\x01')) {
            errsigf(ppVar31->prscxerr,"TADS",0x134);
          }
          ptVar33 = ppVar31->prscxtok;
LAB_0011bf30:
          toknext(ptVar33);
          return;
        }
LAB_0011ce2d:
        errsigf(ctx->prscxerr,"TADS",0x142);
      }
      lVar27 = 0;
      while( true ) {
        prsdef(ctx,&ctx->prscxtok->tokcxcur,7);
        ptVar33 = ctx->prscxtok;
        uVar6 = (ptVar33->tokcxcur).toksym.tokstyp;
        if ((uVar6 != '\x02') && (uVar6 != '\a')) {
          errsigf(ctx->prscxerr,"TADS",0x132);
        }
        sc[lVar27] = (ptVar33->tokcxcur).toksym.toksval;
        iVar18 = toknext(ptVar33);
        if (iVar18 != 0x3f) break;
        toknext(ctx->prscxtok);
        lVar27 = lVar27 + 1;
        if ((int)lVar27 == 0x40) {
          errsigf(ctx->prscxerr,"TADS",0x14b);
        }
      }
      iVar18 = (int)lVar27 + 1;
    }
    else {
      if (iVar18 != 0x49) {
        if (iVar18 == 0x5a) {
          if (uVar24 != 0) {
            errlogf(ctx->prscxerr,"TADS",0x15a);
          }
          prsnreq(ctx,0x46);
          prsreq(ctx,0x3e);
          prsdef(ctx,&tok,10);
          if (tok.toksym.tokstyp == '\n') {
            return;
          }
          errsigf(ctx->prscxerr,"TADS",0x133);
        }
        goto LAB_0011ce2d;
      }
      toknext(ctx->prscxtok);
      iVar18 = 0;
    }
  }
  prsdef(ctx,&tok,7);
  if ((tok.toksym.tokstyp != '\a') && ((uVar24 == 0 || (tok.toksym.tokstyp != '\x02')))) {
    errlogf(ctx->prscxerr,"TADS",0x14c);
    tok.toksym.tokstyp = '\0';
    prsdefobj(ctx,&tok,7);
  }
  if ((uVar24 == 0xce) && (tok.toksym.tokstyp == '\x02')) {
    vocidel(ctx->prscxvoc,tok.toksym.toksval);
    vocdel(ctx->prscxvoc,tok.toksym.toksval);
  }
  tok.toksym.tokstyp = '\x02';
  (*ctx->prscxstab->toktfset)(ctx->prscxstab,&tok.toksym);
  prsobj(ctx,&tok,iVar18,sc,iVar17);
  ppVar31 = ctx;
  if (local_244 != 0) {
    objcomp(ctx->prscxmem,tok.toksym.toksval,ctx->prscxflg & 1);
  }
LAB_0011c9d4:
  prsreq(ppVar31,0x3e);
  return;
}

Assistant:

void prscode(prscxdef *ctx, int markcomp)
{
    int           t;
    noreg tokdef  tok;
    int           parms;
    uchar        *oldplcl;
    uint          oldslcl;
    int           numsc = 0;           /* number of superclasses for object */
    objnum        sc[PRSMAXSC];           /* superclasses of current object */
    objnum       *scp;
    int           classflg = 0;  /* VOCIFCLASS ==> object is a class object */
    toktdef      *oldltab;
    int           varargs;
    uint          curfr;
    toktldef     *ltab;
    int           oldflg;
    int           modflag = 0;                      /* modify/replace flags */
    
    NOREG((&tok))
    
    t = ctx->prscxtok->tokcxcur.toktyp;
    if (t == TOKTEOF) return;            /* end of file; nothing more to do */
    
    /* allow null statements */
    if (t == TOKTSEM)
    {
        toknext(ctx->prscxtok);
        return;
    }

    /* check for special "compound word" construction */
    if (t == TOKTCOMPOUND)
    {
        prscmpd(ctx);
        return;
    }
    
    /* check for special formatString construct */
    if (t == TOKTFORMAT)
    {
        prsfmt(ctx);
        return;
    }
    
    /* check for 'replace' or 'modify' keywords */
    if (t == TOKTREPLACE || t == TOKTMODIFY)
    {
        modflag = t;
        t = toknext(ctx->prscxtok);
    }

    /* check for specialWords construct */
    if (t == TOKTSPECIAL)
    {
        prsspec(ctx, modflag);
        return;
    }

    /* check for 'class' prefix */
    if (t == TOKTCLASS)
    {
        classflg = VOCIFCLASS;
        t = toknext(ctx->prscxtok);
    }

    if (t != TOKTSYMBOL) errsig(ctx->prscxerr, ERR_REQSYM);
    OSCPYSTRUCT(tok, ctx->prscxtok->tokcxcur);

    /* 'modify <object>' skips the colon and goes directly to the body */
    if (modflag == TOKTMODIFY)
    {
        mcmon   newobj;
        uchar  *newptr;
        uchar  *oldptr;
        char    newnam[TOKNAMMAX+1];
        int     len;
        ushort  objsiz;
        lindef *lin;
        
        /* require a previously defined object */
        if (tok.toksym.tokstyp != TOKSTOBJ
            || vocinh(ctx->prscxvoc, tok.toksym.toksval) == 0)
            errsig(ctx->prscxerr, ERR_MODOBJ);

        /* create a copy of the original object */
        objsiz = mcmobjsiz(ctx->prscxmem, (mcmon)tok.toksym.toksval);
        newptr = mcmalo(ctx->prscxmem, objsiz, &newobj);
        oldptr = mcmlck(ctx->prscxmem, (mcmon)tok.toksym.toksval);
        memcpy(newptr, oldptr, (size_t)objsiz);

        /* remember whether the original object was a class */
        if (objflg(newptr) & OBJFCLASS)
            classflg = VOCIFCLASS;

        /*
         *   Set the "superseded by modified object" flag in the
         *   original.  Also set the class flag, because we want the
         *   modified version to inherit location and vocabulary. 
         */
        objsflg(newptr, objflg(newptr) | OBJFMOD | OBJFCLASS);
        mcmtch(ctx->prscxmem, (mcmon)newobj);

        /* done with the objects - unlock them */
        mcmunlck(ctx->prscxmem, (mcmon)tok.toksym.toksval);
        mcmunlck(ctx->prscxmem, newobj);

        /* create a fake symbol table entry for the original data */
        len = tok.toksym.tokslen;
        if (len > TOKNAMMAX - 5) len = TOKNAMMAX - 5;
        sprintf(newnam, "%.*s@%d", len, tok.toksym.toksnam,
                (int)newobj);
        (*ctx->prscxstab->toktfadd)(ctx->prscxstab, newnam,
                                    (int)strlen(newnam), TOKSTOBJ,
                                    (int)newobj, tokhsh(newnam));

        /* the superclass for the new object is simply the old object */
        numsc = 1;
        sc[0] = newobj;

        /* renumber the inheritance records for the old object */
        vociren(ctx->prscxvoc, tok.toksym.toksval, newobj);

        /* go through all line sources and renumber this object */
        for (lin = ctx->prscxvoc->voccxrun->runcxdbg->dbgcxlin ; lin ;
             lin = lin->linnxt)
        {
            /* renumber instances of the object in this line source */
            linrenum(lin, tok.toksym.toksval, newobj);
        }

        /* go parse the object body as normal */
        toknext(ctx->prscxtok);
        goto objbody;
    }
    
    prsnreq(ctx, TOKTCOLON);
    t = ctx->prscxtok->tokcxcur.toktyp;
    switch(t)
    {
    case TOKTEXTERN:
        if (modflag) errlog(ctx->prscxerr, ERR_MODRPLX);
        prsnreq(ctx, TOKTFUNCTION);
        prsreq(ctx, TOKTSEM);
        prsdef(ctx, (tokdef *)&tok, TOKSTEXTERN);
        if (tok.toksym.tokstyp != TOKSTEXTERN)
            errsig(ctx->prscxerr, ERR_REQEXT);
        break;
        
    case TOKTFUNCTION:
        if (modflag == TOKTMODIFY) errlog(ctx->prscxerr, ERR_MODFCN);
        prsdef(ctx, (tokdef *)&tok, TOKSTFWDFN);
        t = toknext(ctx->prscxtok);
        if (t == TOKTSEM)
        {
            if (modflag) errlog(ctx->prscxerr, ERR_MODFWD);
            if (tok.toksym.tokstyp != TOKSTFWDFN &&
                tok.toksym.tokstyp != TOKSTFUNC)
                errsig(ctx->prscxerr, ERR_REQFCN);
            toknext(ctx->prscxtok);
            break;
        }

        /* check that we're not redefining the symbol, then define as fcn */
        if (!(tok.toksym.tokstyp == TOKSTFWDFN
              || (tok.toksym.tokstyp == TOKSTFUNC && modflag == TOKTREPLACE)))
        {
            /* log the error */
            errlog(ctx->prscxerr, ERR_FREDEF);

            /* 
             *   Since the symbol was already defined as something else,
             *   we haven't given it a proper function definition yet.  In
             *   particular, we haven't assigned an object number to the
             *   function.  Do so now by forcing the symbol to undefined
             *   then defining it as a function again.
             *   
             *   Note that we need to force the change in the global
             *   symbol table itself.  This will hose down any previous
             *   definition of the symbol, but this doesn't matter much
             *   since the game is already not playable due to this error.
             */

            /* set it to unknown */
            tok.toksym.tokstyp = TOKSTUNK;

            /* force it back into the global table as unknown */
            (*ctx->prscxstab->toktfset)(ctx->prscxstab,
                                        (toksdef *)&tok.toksym);

            /* define it as a forward function to assign an object ID */
            prsdef(ctx, (tokdef *)&tok, TOKSTFWDFN);
        }

        /* 
         *   make sure the symbol is in the symbol table as a function if
         *   it's not already - it could have been a forward function, in
         *   which case it's time to make it a defined function, since
         *   this is the definition 
         */
        tok.toksym.tokstyp = TOKSTFUNC;
        (*ctx->prscxstab->toktfset)(ctx->prscxstab, (toksdef *)&tok.toksym);
        
        oldltab = ctx->prscxtok->tokcxstab;           /* remember old table */
        oldplcl = ctx->prscxplcl;                /* and old table pool data */
        oldslcl = ctx->prscxslcl;

        varargs = FALSE;
        parms = 0;
        curfr = 0;                                /* no enclosing frame yet */
        ltab = (toktldef *)0;                  /* no local symbol table yet */
        if (t == TOKTLPAR)
        {
            ltab = prsvlst(ctx, (toktldef *)0, (prsndef **)0, &parms, TRUE,
                           &varargs, curfr);
            prsreq(ctx, TOKTRPAR);
        }
        
        /*
         *   If we're replacing this function, delete any references in
         *   line number records to this object; this will prevent the
         *   debugger from attempting to use these records, which will be
         *   invalid after we replace the object's pcode with the new
         *   pcode here.  
         */
        if (modflag == TOKTREPLACE)
        {
            lindef *lin;
            for (lin = ctx->prscxvoc->voccxrun->runcxdbg->dbgcxlin ; lin ;
                 lin = lin->linnxt)
            {
                /* delete instances of the object in this line source */
                lindelnum(lin, (objnum)tok.toksym.toksval);
            }
        }

        /* set up emit context for the new object */
        ctx->prscxemt->emtcxptr = mcmlck(ctx->prscxmem,
                                         (mcmon)tok.toksym.toksval);
        ctx->prscxemt->emtcxofs = 0;
        ctx->prscxemt->emtcxobj = tok.toksym.toksval;

        /* flag that we're doing a function - no "self" */
        oldflg = ctx->prscxflg;
        ctx->prscxflg |= PRSCXFFUNC;
        
        /* now parse the body of the function */
        ERRBEGIN(ctx->prscxerr)
            
        if (ctx->prscxflg & PRSCXFARC)
        {
            emtop(ctx->prscxemt, OPCCHKARGC);
            emtbyte(ctx->prscxemt, (varargs ? 0x80 : 0 ) + parms);
        }
        
        /* if there's a local symbol table, set up debug record */
        if (ltab) prsvgfr(ctx, ltab, &curfr);
        
        if (ctx->prscxtok->tokcxcur.toktyp != TOKTLBRACE)
            prssigreq(ctx, TOKTLBRACE);
        prsstm(ctx, EMTLLNKEND, EMTLLNKEND, parms, 0, 0, (prscsdef *)0,
               curfr);
        
        /* be sure to emit a 'return' at the end of the function */
        emtop(ctx->prscxemt, OPCRETURN);
        emtint2(ctx->prscxemt, 0);
        
        /* restore local symbol table information in context */
        ctx->prscxplcl = oldplcl;
        ctx->prscxslcl = oldslcl;
        
        /* resize the object down to the actual space needed */
        mcmrealo(ctx->prscxmem, (mcmon)tok.toksym.toksval,
                 (ushort)ctx->prscxemt->emtcxofs);
        
        /* tell cache manager the object's been changed, and unlock it */
        mcmtch(ctx->prscxmem, (mcmon)tok.toksym.toksval);
        mcmunlck(ctx->prscxmem, (mcmon)tok.toksym.toksval);

        /* to prevent stray writes to this object... */
        ctx->prscxemt->emtcxptr = (uchar *)0;
        
        /* clean up context changes, and delete labels */
        ctx->prscxtok->tokcxstab = oldltab;
        ctx->prscxflg = oldflg;
        prsdelgoto(ctx);

        ERRCLEAN(ctx->prscxerr)
            ctx->prscxplcl = oldplcl;
            ctx->prscxslcl = oldslcl;
            ctx->prscxtok->tokcxstab = oldltab;
            ctx->prscxflg = oldflg;
            prsdelgoto(ctx);
            mcmunlck(ctx->prscxmem, (mcmon)tok.toksym.toksval);
        ERRENDCLN(ctx->prscxerr)
        
        break;  
        
    case TOKTSYMBOL:
        for (scp = sc ;;)
        {
            int typ;
            
            /* check that we have room for a new superclass */
            if (numsc >= PRSMAXSC) errsig(ctx->prscxerr, ERR_MANYSC);

            /* define superclass symbol as object if not already done */
            prsdef(ctx, &ctx->prscxtok->tokcxcur, TOKSTFWDOBJ);
            typ = ctx->prscxtok->tokcxcur.toksym.tokstyp;
            if (typ != TOKSTOBJ && typ != TOKSTFWDOBJ)
                errsig(ctx->prscxerr, ERR_REQOBJ);
            
            /* add the object to the superclass array */
            *scp++ = ctx->prscxtok->tokcxcur.toksym.toksval;
            ++numsc;
            
            /* skip the token, and keep going as long as the list continues */
            if (toknext(ctx->prscxtok) != TOKTCOMMA) break;
            typ = toknext(ctx->prscxtok);        /* get next object in list */
        }
        goto objbody;
        /* FALLTHROUGH */
        
    case TOKTOBJECT:
        toknext(ctx->prscxtok);
    objbody:
        prsdef(ctx, (tokdef *)&tok, TOKSTFWDOBJ);
        if (!(tok.toksym.tokstyp == TOKSTFWDOBJ
              || (tok.toksym.tokstyp == TOKSTOBJ && modflag != 0)))
        {
            /* 
             *   it's already defined globally as something other than an
             *   object - log an error 
             */
            errlog(ctx->prscxerr, ERR_OREDEF);

            /* 
             *   actually redefine the symbol as an object, so that we can
             *   proceed with the compilation 
             */
            tok.toksym.tokstyp = TOKSTUNK;
            prsdefobj(ctx, (tokdef *)&tok, TOKSTFWDOBJ);
        }

        /* if we're replacing the object, delete its vocabulary records */
        if (modflag == TOKTREPLACE && tok.toksym.tokstyp == TOKSTOBJ)
        {
            vocidel(ctx->prscxvoc, (objnum)tok.toksym.toksval);
            vocdel(ctx->prscxvoc, (objnum)tok.toksym.toksval);
        }

        /* make the symbol refer to an object now */
        tok.toksym.tokstyp = TOKSTOBJ;
        (*ctx->prscxstab->toktfset)(ctx->prscxstab, (toksdef *)&tok.toksym);

        /* compile the object */
        prsobj(ctx, &tok, numsc, sc, classflg);
        if (markcomp)
            objcomp(ctx->prscxmem, (objnum)tok.toksym.toksval,
                    (ctx->prscxflg & PRSCXFLIN) != 0);
        
        prsreq(ctx, TOKTSEM);
        break;
        
    default:
        errsig(ctx->prscxerr, ERR_SYNTAX);
    }
}